

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgload.c
# Opt level: O1

FT_Error tt_get_metrics(TT_Loader loader,FT_UInt glyph_index)

{
  TT_Face face;
  FT_Stream stream;
  FT_Error FVar1;
  FT_ULong pos;
  undefined8 local_38;
  FT_Short left_bearing;
  FT_Short top_bearing;
  FT_UShort advance_width;
  FT_UShort advance_height;
  
  face = loader->face;
  stream = loader->stream;
  local_38 = 0;
  pos = FT_Stream_Pos(stream);
  (**(code **)((long)face->sfnt + 0xe0))(face,0,glyph_index,&local_38,(long)&local_38 + 4);
  TT_Get_VMetrics(face,glyph_index,(loader->bbox).yMax,(FT_Short *)((long)&local_38 + 2),
                  (FT_UShort *)((long)&local_38 + 6));
  FVar1 = FT_Stream_Seek(stream,pos);
  if (FVar1 == 0) {
    loader->left_bearing = (int)(short)local_38;
    loader->advance = (uint)local_38._4_2_;
    loader->top_bearing = (int)local_38._2_2_;
    loader->vadvance = (uint)local_38._6_2_;
    if (loader->linear_def == '\0') {
      loader->linear_def = '\x01';
      loader->linear = (uint)local_38._4_2_;
    }
    FVar1 = 0;
  }
  return FVar1;
}

Assistant:

static FT_Error
  tt_get_metrics( TT_Loader  loader,
                  FT_UInt    glyph_index )
  {
    TT_Face    face   = loader->face;
#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    TT_Driver  driver = (TT_Driver)FT_FACE_DRIVER( face );
#endif

    FT_Error   error;
    FT_Stream  stream = loader->stream;

    FT_Short   left_bearing = 0, top_bearing = 0;
    FT_UShort  advance_width = 0, advance_height = 0;

    /* we must preserve the stream position          */
    /* (which gets altered by the metrics functions) */
    FT_ULong  pos = FT_STREAM_POS();


    TT_Get_HMetrics( face, glyph_index,
                     &left_bearing,
                     &advance_width );
    TT_Get_VMetrics( face, glyph_index,
                     loader->bbox.yMax,
                     &top_bearing,
                     &advance_height );

    if ( FT_STREAM_SEEK( pos ) )
      return error;

    loader->left_bearing = left_bearing;
    loader->advance      = advance_width;
    loader->top_bearing  = top_bearing;
    loader->vadvance     = advance_height;

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY
    if ( driver->interpreter_version == TT_INTERPRETER_VERSION_38 &&
         loader->exec                                             )
    {
      loader->exec->sph_tweak_flags = 0;

      /* This may not be the right place for this, but it works...  */
      /* Note that we have to unconditionally load the tweaks since */
      /* it is possible that glyphs individually switch ClearType's */
      /* backward compatibility mode on and off.                    */
      sph_set_tweaks( loader, glyph_index );
    }
#endif /* TT_SUPPORT_SUBPIXEL_HINTING_INFINALITY */

    if ( !loader->linear_def )
    {
      loader->linear_def = 1;
      loader->linear     = advance_width;
    }

    return FT_Err_Ok;
  }